

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_decompressSequences
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  BYTE *pBVar1;
  byte bVar2;
  byte bVar3;
  undefined8 uVar4;
  seq_t sequence;
  bool bVar5;
  U32 i;
  size_t sVar6;
  long lVar7;
  byte bVar8;
  byte bVar9;
  size_t *psVar10;
  BYTE *pBVar11;
  ulong uVar12;
  uint uVar13;
  BYTE *pBVar14;
  size_t unaff_RBX;
  BYTE *pBVar15;
  BYTE *__dest;
  int iVar16;
  uint uVar17;
  BYTE *oend;
  ulong uVar18;
  size_t sVar19;
  BYTE *litPtr;
  BIT_DStream_t local_118;
  ZSTD_fseState local_f0;
  ZSTD_fseState local_e0;
  ZSTD_fseState local_d0;
  size_t local_c0 [3];
  ulong uStack_a8;
  BYTE *local_a0;
  BYTE *local_98;
  BYTE *local_90;
  BYTE *local_88;
  ulong local_80;
  ulong uStack_78;
  size_t local_70;
  size_t local_68;
  BYTE *local_60;
  BYTE *local_58;
  BYTE *local_50;
  BYTE *local_48;
  ZSTD_DCtx *local_40;
  ulong local_38;
  
  if (dctx->bmi2 != 0) {
    sVar6 = ZSTD_decompressSequences_bmi2
                      (dctx,dst,maxDstSize,seqStart,seqSize,nbSeq,isLongOffset,frame);
    return sVar6;
  }
  if (dctx->litBufferLocation == ZSTD_not_in_dst) {
    oend = (BYTE *)(maxDstSize + (long)dst);
  }
  else {
    oend = dctx->litBuffer;
  }
  local_90 = dctx->litPtr;
  local_88 = local_90 + dctx->litSize;
  pBVar15 = (BYTE *)dst;
  if (nbSeq == 0) goto LAB_0018860e;
  pBVar15 = (BYTE *)dctx->prefixStart;
  local_58 = (BYTE *)dctx->virtualStart;
  local_60 = (BYTE *)dctx->dictEnd;
  dctx->fseEntropy = 1;
  lVar7 = -0xc;
  do {
    *(ulong *)((long)&uStack_a8 + lVar7 * 2) =
         (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar7);
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0);
  local_a0 = (BYTE *)dst;
  if (seqSize == 0) {
    local_118.ptr = (char *)0x0;
    local_118.start = (char *)0x0;
    local_118.bitContainer = 0;
    local_118.bitsConsumed = 0;
    local_118._12_4_ = 0;
    local_118.limitPtr = (char *)0x0;
LAB_00187d80:
    bVar5 = false;
    unaff_RBX = 0xffffffffffffffec;
  }
  else {
    local_118.limitPtr = (char *)((long)seqStart + 8);
    local_118.start = (char *)seqStart;
    if (seqSize < 8) {
      local_118.bitContainer = (size_t)*seqStart;
      switch(seqSize) {
      case 7:
        local_118.bitContainer =
             (ulong)*(byte *)((long)seqStart + 6) << 0x30 | local_118.bitContainer;
      case 6:
        local_118.bitContainer =
             local_118.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
      case 5:
        local_118.bitContainer =
             local_118.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
      case 4:
        local_118.bitContainer =
             local_118.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
      case 3:
        local_118.bitContainer =
             local_118.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
      case 2:
        local_118.bitContainer =
             local_118.bitContainer + (ulong)*(byte *)((long)seqStart + 1) * 0x100;
      }
      bVar2 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar17 = 0x1f;
      if (bVar2 != 0) {
        for (; bVar2 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      local_118.bitsConsumed = ~uVar17 + 9;
      if (bVar2 == 0) {
        local_118.bitsConsumed = 0;
      }
      local_118.ptr = (char *)seqStart;
      if (bVar2 == 0) goto LAB_00187d80;
      local_118.bitsConsumed = local_118.bitsConsumed + (int)seqSize * -8 + 0x40;
    }
    else {
      local_118.ptr = (char *)((long)seqStart + (seqSize - 8));
      local_118.bitContainer = *(size_t *)local_118.ptr;
      bVar2 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar17 = 0x1f;
      if (bVar2 != 0) {
        for (; bVar2 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      local_118.bitsConsumed = ~uVar17 + 9;
      if (bVar2 == 0) {
        local_118.bitsConsumed = 0;
      }
      if (bVar2 == 0 || 0xffffffffffffff88 < seqSize) goto LAB_00187d80;
    }
    ZSTD_initFseState(&local_f0,&local_118,dctx->LLTptr);
    ZSTD_initFseState(&local_e0,&local_118,dctx->OFTptr);
    local_40 = dctx;
    ZSTD_initFseState(&local_d0,&local_118,dctx->MLTptr);
    if (local_a0 == (BYTE *)0x0) {
      __assert_fail("dst != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xaabe,
                    "size_t ZSTD_decompressSequences_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                   );
    }
    local_48 = oend + -0x20;
    local_50 = pBVar15;
    dst = local_a0;
    do {
      bVar2 = local_f0.table[local_f0.state].nbAdditionalBits;
      if (0x10 < bVar2) {
        __assert_fail("llBits <= MaxLLBits",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa948,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
      }
      bVar9 = local_d0.table[local_d0.state].nbAdditionalBits;
      if (0x10 < bVar9) {
        __assert_fail("mlBits <= MaxMLBits",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa949,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
      }
      local_98 = (BYTE *)dst;
      bVar3 = local_e0.table[local_e0.state].nbAdditionalBits;
      if (0x1f < bVar3) {
        __assert_fail("ofBits <= MaxOff",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa94a,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
      }
      uStack_78 = (ulong)local_d0.table[local_d0.state].baseValue;
      uVar17 = local_f0.table[local_f0.state].baseValue;
      local_80 = (ulong)uVar17;
      local_38 = (ulong)local_d0.table[local_d0.state].nextState;
      bVar8 = (byte)local_118.bitsConsumed;
      if (bVar3 < 2) {
        if (bVar3 != 0) {
          local_118.bitsConsumed = local_118.bitsConsumed + 1;
          lVar7 = (ulong)(local_e0.table[local_e0.state].baseValue + (uint)(uVar17 == 0)) -
                  ((long)(local_118.bitContainer << (bVar8 & 0x3f)) >> 0x3f);
          if (lVar7 == 3) {
            local_c0[0] = local_c0[0] - 1;
          }
          else {
            local_c0[0] = local_c0[lVar7];
          }
          sVar6 = local_c0[0] + (local_c0[0] == 0);
          if (lVar7 != 1) goto LAB_00187faf;
          goto LAB_00187fbf;
        }
        sVar6 = local_c0[uVar17 == 0];
        psVar10 = local_c0 + (uVar17 != 0);
      }
      else {
        local_118.bitsConsumed = local_118.bitsConsumed + bVar3;
        sVar6 = ((local_118.bitContainer << (bVar8 & 0x3f)) >> (-bVar3 & 0x3f)) +
                (ulong)local_e0.table[local_e0.state].baseValue;
LAB_00187faf:
        local_c0[2] = local_c0[1];
LAB_00187fbf:
        psVar10 = local_c0;
      }
      local_c0[1] = *psVar10;
      local_c0[0] = sVar6;
      if (bVar9 != 0) {
        bVar8 = (byte)local_118.bitsConsumed;
        local_118.bitsConsumed = local_118.bitsConsumed + bVar9;
        uStack_78 = uStack_78 + ((local_118.bitContainer << (bVar8 & 0x3f)) >> (-bVar9 & 0x3f));
      }
      if ((0x1e < (byte)(bVar9 + bVar2 + bVar3)) && (local_118.bitsConsumed < 0x41)) {
        if (local_118.ptr < local_118.limitPtr) {
          if (local_118.ptr == local_118.start) goto LAB_00188037;
          uVar17 = (int)local_118.ptr - (int)local_118.start;
          if (local_118.start <=
              (ulong *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3))) {
            uVar17 = local_118.bitsConsumed >> 3;
          }
          uVar13 = local_118.bitsConsumed + uVar17 * -8;
        }
        else {
          uVar17 = local_118.bitsConsumed >> 3;
          uVar13 = local_118.bitsConsumed & 7;
        }
        local_118.ptr = (char *)((long)local_118.ptr - (ulong)uVar17);
        local_118.bitsConsumed = uVar13;
        local_118.bitContainer = *(size_t *)local_118.ptr;
      }
LAB_00188037:
      if (bVar2 != 0) {
        bVar9 = (byte)local_118.bitsConsumed;
        local_118.bitsConsumed = local_118.bitsConsumed + bVar2;
        local_80 = local_80 + ((local_118.bitContainer << (bVar9 & 0x3f)) >> (-bVar2 & 0x3f));
      }
      iVar16 = local_f0.table[local_f0.state].nbBits + local_118.bitsConsumed;
      local_f0.state =
           (~(-1L << (local_f0.table[local_f0.state].nbBits & 0x3f)) &
           local_118.bitContainer >> (-(char)iVar16 & 0x3fU)) +
           (ulong)local_f0.table[local_f0.state].nextState;
      iVar16 = iVar16 + (uint)local_d0.table[local_d0.state].nbBits;
      local_d0.state =
           (~(-1L << (local_d0.table[local_d0.state].nbBits & 0x3f)) &
           local_118.bitContainer >> (-(char)iVar16 & 0x3fU)) +
           (ulong)local_d0.table[local_d0.state].nextState;
      uVar17 = iVar16 + (uint)local_e0.table[local_e0.state].nbBits;
      local_118.bitsConsumed = uVar17;
      local_e0.state =
           (~(-1L << (local_e0.table[local_e0.state].nbBits & 0x3f)) &
           local_118.bitContainer >> (-(char)uVar17 & 0x3fU)) +
           (ulong)local_e0.table[local_e0.state].nextState;
      local_70 = sVar6;
      pBVar15 = local_90 + local_80;
      if (local_88 < pBVar15) {
LAB_00188335:
        sequence.matchLength = uStack_78;
        sequence.litLength = local_80;
        sequence.offset = sVar6;
        sVar19 = ZSTD_execSequenceEnd
                           ((BYTE *)dst,oend,sequence,&local_90,local_88,local_50,local_58,local_60)
        ;
      }
      else {
        sVar19 = uStack_78 + local_80;
        pBVar1 = (BYTE *)((long)dst + sVar19);
        if (local_48 < pBVar1) goto LAB_00188335;
        if ((long)local_80 < 0) {
          __assert_fail("op <= oLitEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa863,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if ((long)sVar19 <= (long)local_80) {
          __assert_fail("oLitEnd < oMatchEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa864,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if (oend < pBVar1) {
          __assert_fail("oMatchEnd <= oend",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa865,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        __dest = (BYTE *)((long)dst + local_80);
        if (local_48 < __dest) {
          __assert_fail("oLitEnd <= oend_w",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa867,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        uVar4 = *(undefined8 *)(local_90 + 8);
        *(undefined8 *)dst = *(undefined8 *)local_90;
        *(undefined8 *)((long)dst + 8) = uVar4;
        if (0x10 < local_80) {
          ZSTD_decompressSequences_cold_1();
        }
        pBVar11 = local_50;
        local_90 = pBVar15;
        pBVar15 = __dest + -sVar6;
        if ((ulong)((long)__dest - (long)local_50) < local_70) {
          if ((ulong)((long)__dest - (long)local_58) < local_70) {
            sVar19 = 0xffffffffffffffec;
          }
          else {
            lVar7 = (long)(__dest + -sVar6) - (long)local_50;
            pBVar15 = local_60 + lVar7;
            if (local_60 < pBVar15 + uStack_78) {
              memmove(__dest,pBVar15,-lVar7);
              __dest = __dest + -lVar7;
              uStack_78 = uStack_78 + lVar7;
              pBVar15 = pBVar11;
              goto LAB_00188207;
            }
            memmove(__dest,pBVar15,uStack_78);
          }
        }
        else {
LAB_00188207:
          if (pBVar1 < __dest) {
            __assert_fail("op <= oMatchEnd",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa888,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (pBVar15 < pBVar11) {
            __assert_fail("match >= prefixStart",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa88a,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (uStack_78 == 0) {
            __assert_fail("sequence.matchLength >= 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa88b,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (local_70 < 0x10) {
            if (__dest < pBVar15) {
              __assert_fail("*ip <= *op",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa783,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
            }
            if (local_70 < 8) {
              iVar16 = *(int *)(ZSTD_overlapCopy8_dec64table + local_70 * 4);
              *__dest = *pBVar15;
              __dest[1] = pBVar15[1];
              __dest[2] = pBVar15[2];
              __dest[3] = pBVar15[3];
              pBVar11 = pBVar15 + *(uint *)(ZSTD_overlapCopy8_dec32table + local_70 * 4);
              pBVar15 = pBVar15 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + local_70 * 4) -
                                  (long)iVar16);
              *(undefined4 *)(__dest + 4) = *(undefined4 *)pBVar11;
            }
            else {
              *(undefined8 *)__dest = *(undefined8 *)pBVar15;
            }
            pBVar11 = pBVar15 + 8;
            pBVar14 = __dest + 8;
            lVar7 = (long)pBVar14 - (long)pBVar11;
            if (lVar7 < 8) {
              __assert_fail("*op - *ip >= 8",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa795,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
            }
            if (8 < uStack_78) {
              if (pBVar1 <= pBVar14) {
                __assert_fail("op < oMatchEnd",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa89f,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              if (lVar7 < 0x10) {
                do {
                  *(undefined8 *)pBVar14 = *(undefined8 *)pBVar11;
                  pBVar14 = pBVar14 + 8;
                  pBVar11 = pBVar11 + 8;
                } while (pBVar14 < __dest + uStack_78);
              }
              else {
                if (0xffffffffffffffe0 < lVar7 - 0x10U) goto LAB_0018881f;
                uVar4 = *(undefined8 *)(pBVar15 + 0x10);
                *(undefined8 *)pBVar14 = *(undefined8 *)pBVar11;
                *(undefined8 *)(__dest + 0x10) = uVar4;
                if (0x18 < (long)uStack_78) {
                  lVar7 = 0;
                  do {
                    uVar4 = *(undefined8 *)(pBVar15 + lVar7 + 0x18 + 8);
                    pBVar1 = __dest + lVar7 + 0x18;
                    *(undefined8 *)pBVar1 = *(undefined8 *)(pBVar15 + lVar7 + 0x18);
                    *(undefined8 *)(pBVar1 + 8) = uVar4;
                    uVar4 = *(undefined8 *)(pBVar15 + lVar7 + 0x28 + 8);
                    *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)(pBVar15 + lVar7 + 0x28);
                    *(undefined8 *)(pBVar1 + 0x18) = uVar4;
                    lVar7 = lVar7 + 0x20;
                  } while (pBVar1 + 0x20 < __dest + uStack_78);
                }
              }
            }
          }
          else {
            if ((BYTE *)0xffffffffffffffe0 < __dest + (-0x10 - (long)pBVar15)) {
LAB_0018881f:
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar4 = *(undefined8 *)(pBVar15 + 8);
            *(undefined8 *)__dest = *(undefined8 *)pBVar15;
            *(undefined8 *)(__dest + 8) = uVar4;
            if (0x10 < (long)uStack_78) {
              lVar7 = 0x10;
              do {
                uVar4 = *(undefined8 *)(pBVar15 + lVar7 + 8);
                pBVar1 = __dest + lVar7;
                *(undefined8 *)pBVar1 = *(undefined8 *)(pBVar15 + lVar7);
                *(undefined8 *)(pBVar1 + 8) = uVar4;
                uVar4 = *(undefined8 *)(pBVar15 + lVar7 + 0x10 + 8);
                *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)(pBVar15 + lVar7 + 0x10);
                *(undefined8 *)(pBVar1 + 0x18) = uVar4;
                lVar7 = lVar7 + 0x20;
              } while (pBVar1 + 0x20 < __dest + uStack_78);
            }
          }
        }
      }
      if (sVar19 < 0xffffffffffffff89) {
        dst = local_98 + sVar19;
        iVar16 = 0;
        nbSeq = nbSeq + -1;
        if (nbSeq == 0) {
          iVar16 = 5;
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if (local_118.bitsConsumed < 0x41) {
            if (local_118.ptr < local_118.limitPtr) {
              if (local_118.ptr == local_118.start) goto LAB_00188328;
              uVar17 = (int)local_118.ptr - (int)local_118.start;
              if (local_118.start <=
                  (ulong *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3))) {
                uVar17 = local_118.bitsConsumed >> 3;
              }
              uVar13 = local_118.bitsConsumed + uVar17 * -8;
            }
            else {
              uVar17 = local_118.bitsConsumed >> 3;
              uVar13 = local_118.bitsConsumed & 7;
            }
            local_118.ptr = (char *)((long)local_118.ptr - (ulong)uVar17);
            local_118.bitsConsumed = uVar13;
            local_118.bitContainer = *(size_t *)local_118.ptr;
          }
        }
      }
      else {
        iVar16 = 1;
        bVar5 = false;
        local_68 = sVar19;
        dst = local_98;
      }
LAB_00188328:
    } while (iVar16 == 0);
    unaff_RBX = local_68;
    if (iVar16 == 5) {
      if (nbSeq == 0) {
        if (0x40 < local_118.bitsConsumed) {
LAB_001885d7:
          lVar7 = 0;
          do {
            (local_40->entropy).rep[lVar7] = (U32)local_c0[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          bVar5 = true;
          goto LAB_00188602;
        }
        if (local_118.ptr < local_118.limitPtr) {
          if (local_118.ptr == local_118.start) {
            if (local_118.bitsConsumed != 0x40) goto LAB_001885b7;
            goto LAB_001885d7;
          }
          uVar12 = (ulong)(uint)((int)local_118.ptr - (int)local_118.start);
          if (local_118.start <=
              (ulong *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3))) {
            uVar12 = (ulong)(local_118.bitsConsumed >> 3);
          }
          uVar17 = local_118.bitsConsumed + (int)uVar12 * -8;
        }
        else {
          uVar12 = (ulong)(local_118.bitsConsumed >> 3);
          uVar17 = local_118.bitsConsumed & 7;
        }
        local_118.ptr = (char *)((long)local_118.ptr - uVar12);
        local_118.bitsConsumed = uVar17;
        local_118.bitContainer = *(size_t *)local_118.ptr;
      }
LAB_001885b7:
      bVar5 = false;
      unaff_RBX = 0xffffffffffffffec;
    }
  }
LAB_00188602:
  pBVar15 = local_a0;
  if (!bVar5) {
    return unaff_RBX;
  }
LAB_0018860e:
  uVar12 = (long)local_88 - (long)local_90;
  uVar18 = (long)oend - (long)dst;
  if (uVar18 < uVar12) {
    unaff_RBX = 0xffffffffffffffba;
  }
  else if ((BYTE *)dst == (BYTE *)0x0) {
    dst = (BYTE *)0x0;
  }
  else {
    memcpy(dst,local_90,uVar12);
    dst = (void *)((long)dst + uVar12);
  }
  if (uVar12 <= uVar18) {
    unaff_RBX = (long)dst - (long)pBVar15;
  }
  return unaff_RBX;
}

Assistant:

static size_t
ZSTD_decompressSequences(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                   const void* seqStart, size_t seqSize, int nbSeq,
                   const ZSTD_longOffset_e isLongOffset,
                   const int frame)
{
    DEBUGLOG(5, "ZSTD_decompressSequences");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequences_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
    }
#endif
    return ZSTD_decompressSequences_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}